

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.hpp
# Opt level: O1

time_t __thiscall TUPU::TImage::time_abi_cxx11_(TImage *this,time_t *__timer)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  string *__str;
  char cVar4;
  
  __val = __timer[0x11];
  cVar4 = '\x01';
  if (9 < __val) {
    uVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_001e47d6;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_001e47d6;
      }
      if (uVar3 < 10000) goto LAB_001e47d6;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_001e47d6:
  this->_vptr_TImage = (_func_int **)&(this->m_url)._M_string_length;
  std::__cxx11::string::_M_construct((ulong)this,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)this->_vptr_TImage,*(uint *)&(this->m_url)._M_dataplus._M_p,__val);
  return (time_t)this;
}

Assistant:

const std::string time() const { return std::to_string(m_ts); }